

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigManager.cpp
# Opt level: O2

ChannelPtr __thiscall cali::ConfigManager::get_channel(ConfigManager *this,char *name)

{
  __shared_ptr<cali::ChannelController,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  __shared_ptr<cali::ChannelController,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  ChannelPtr CVar5;
  string local_50;
  
  p_Var4 = (__shared_ptr<cali::ChannelController,_(__gnu_cxx::_Lock_policy)2> *)
           **(undefined8 **)name;
  p_Var1 = (__shared_ptr<cali::ChannelController,_(__gnu_cxx::_Lock_policy)2> *)
           (*(undefined8 **)name)[1];
  _Var3._M_pi = in_RDX;
  do {
    if (p_Var4 == p_Var1) {
      (this->mP).
      super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      (this->mP).
      super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_00201c92:
      CVar5.super___shared_ptr<cali::ChannelController,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Var3._M_pi;
      CVar5.super___shared_ptr<cali::ChannelController,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (ChannelPtr)
             CVar5.super___shared_ptr<cali::ChannelController,_(__gnu_cxx::_Lock_policy)2>;
    }
    ChannelController::name_abi_cxx11_(&local_50,p_Var4->_M_ptr);
    bVar2 = std::operator==(&local_50,(char *)in_RDX);
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar2) {
      std::__shared_ptr<cali::ChannelController,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<cali::ChannelController,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var4);
      _Var3._M_pi = extraout_RDX_00;
      goto LAB_00201c92;
    }
    p_Var4 = p_Var4 + 1;
    _Var3._M_pi = extraout_RDX;
  } while( true );
}

Assistant:

ConfigManager::ChannelPtr ConfigManager::get_channel(const char* name) const
{
    for (ChannelPtr& chn : mP->m_channels)
        if (chn->name() == name)
            return chn;

    return ChannelPtr();
}